

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3MatchEName(ExprList_item *pItem,char *zCol,char *zTab,char *zDb,int *pbRowid)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  undefined4 *in_R8;
  int eEName;
  char *zSpan;
  int n;
  undefined2 in_stack_ffffffffffffffb8;
  undefined1 uVar4;
  undefined1 uVar5;
  int local_34;
  int local_4;
  
  uVar1 = (uint)(*(ushort *)(in_RDI + 0x11) & 3);
  if ((uVar1 == 2) || ((uVar1 == 3 && (in_R8 != (undefined4 *)0x0)))) {
    pcVar3 = *(char **)(in_RDI + 8);
    local_34 = 0;
    while( true ) {
      uVar5 = false;
      if (pcVar3[local_34] != '\0') {
        uVar5 = pcVar3[local_34] != '.';
      }
      if ((bool)uVar5 == false) break;
      local_34 = local_34 + 1;
    }
    if ((in_RCX == (char *)0x0) ||
       ((iVar2 = sqlite3_strnicmp(pcVar3,in_RCX,local_34), iVar2 == 0 && (in_RCX[local_34] == '\0'))
       )) {
      pcVar3 = pcVar3 + (local_34 + 1);
      local_34 = 0;
      while( true ) {
        uVar4 = false;
        if (pcVar3[local_34] != '\0') {
          uVar4 = pcVar3[local_34] != '.';
        }
        if ((bool)uVar4 == false) break;
        local_34 = local_34 + 1;
      }
      if ((in_RDX == (char *)0x0) ||
         ((iVar2 = sqlite3_strnicmp(pcVar3,in_RDX,local_34), iVar2 == 0 &&
          (in_RDX[local_34] == '\0')))) {
        if (in_RSI != (char *)0x0) {
          if ((uVar1 == 2) && (iVar2 = sqlite3StrICmp(pcVar3 + (local_34 + 1),in_RSI), iVar2 != 0))
          {
            return 0;
          }
          if ((uVar1 == 3) &&
             (iVar2 = sqlite3IsRowid((char *)CONCAT44(3,CONCAT13(uVar5,CONCAT12(uVar4,
                                                  in_stack_ffffffffffffffb8)))), iVar2 == 0)) {
            return 0;
          }
        }
        if (uVar1 == 3) {
          *in_R8 = 1;
        }
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3MatchEName(
  const struct ExprList_item *pItem,
  const char *zCol,
  const char *zTab,
  const char *zDb,
  int *pbRowid
){
  int n;
  const char *zSpan;
  int eEName = pItem->fg.eEName;
  if( eEName!=ENAME_TAB && (eEName!=ENAME_ROWID || NEVER(pbRowid==0)) ){
    return 0;
  }
  assert( pbRowid==0 || *pbRowid==0 );
  zSpan = pItem->zEName;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zDb && (sqlite3StrNICmp(zSpan, zDb, n)!=0 || zDb[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zTab && (sqlite3StrNICmp(zSpan, zTab, n)!=0 || zTab[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  if( zCol ){
    if( eEName==ENAME_TAB && sqlite3StrICmp(zSpan, zCol)!=0 ) return 0;
    if( eEName==ENAME_ROWID && sqlite3IsRowid(zCol)==0 ) return 0;
  }
  if( eEName==ENAME_ROWID ) *pbRowid = 1;
  return 1;
}